

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int64_t archive_read_format_rar_seek_data(archive_read *a,int64_t offset,int whence)

{
  byte *pbVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int64_t iVar5;
  ulong uVar6;
  long lVar7;
  char *fmt;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lStack_20;
  
  pbVar1 = (byte *)a->format->data;
  if (pbVar1[0x17] == 0x30) {
    if (whence == 1) {
      lVar4 = 0xc0;
LAB_004943b9:
      lVar4 = *(long *)(pbVar1 + lVar4);
    }
    else {
      if (whence == 2) {
        lVar4 = 0x28;
        goto LAB_004943b9;
      }
      lVar4 = 0;
    }
    lVar4 = lVar4 + offset;
    if (lVar4 < 0) {
      return -1;
    }
    if (*(long *)(pbVar1 + 0x28) < lVar4) {
      *(long *)(pbVar1 + 0xc0) = lVar4;
      lVar4 = *(long *)(pbVar1 + 0x28);
    }
    lVar7 = *(long *)(pbVar1 + 0xf8);
    lVar4 = lVar4 + *(long *)(lVar7 + 8);
    uVar6 = (ulong)*(uint *)(pbVar1 + 0x100);
    for (lVar8 = 0; uVar6 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
      lVar4 = (lVar4 + *(long *)(lVar7 + 0x20 + lVar8)) - *(long *)(lVar7 + 0x10 + lVar8);
    }
    if ((*pbVar1 & 1) != 0) {
      do {
        while( true ) {
          iVar3 = (int)uVar6;
          lVar8 = *(long *)(lVar7 + 8 + uVar6 * 0x18);
          if ((lVar4 < lVar8) && ((pbVar1[0x18] & 1) != 0)) break;
          lVar8 = *(long *)(lVar7 + 0x10 + uVar6 * 0x18);
          if ((lVar4 - lVar8 == 0 || lVar4 < lVar8) || ((pbVar1[0x18] & 2) == 0)) goto LAB_00494416;
          uVar9 = iVar3 + 1;
          *(uint *)(pbVar1 + 0x100) = uVar9;
          if ((uVar9 < *(uint *)(pbVar1 + 0x104)) &&
             (*(long *)(lVar7 + 0x10 + (ulong)uVar9 * 0x18) < lVar4)) {
            lVar4 = (lVar4 - lVar8) + *(long *)((ulong)uVar9 * 0x18 + lVar7 + 8);
            uVar6 = (ulong)uVar9;
          }
          else {
            *(int *)(pbVar1 + 0x100) = iVar3;
            iVar5 = __archive_read_seek(a,lVar8,0);
            if (iVar5 < 0) {
              return iVar5;
            }
            iVar3 = archive_read_format_rar_read_header(a,a->entry);
            if (iVar3 == 1) {
              pbVar1[0xf4] = 1;
              iVar3 = archive_read_format_rar_read_header(a,a->entry);
            }
            if (iVar3 != 0) goto LAB_004945dd;
            lVar7 = *(long *)(pbVar1 + 0xf8);
            uVar6 = (ulong)*(uint *)(pbVar1 + 0x100);
            lVar4 = (lVar4 + *(long *)(lVar7 + 8 + uVar6 * 0x18)) -
                    *(long *)(lVar7 + 0x10 + (ulong)(*(uint *)(pbVar1 + 0x100) - 1) * 0x18);
          }
        }
        if (iVar3 == 0) {
          fmt = "Attempt to seek past beginning of RAR data block";
          goto LAB_004943a3;
        }
        uVar6 = (ulong)(iVar3 - 1U);
        *(uint *)(pbVar1 + 0x100) = iVar3 - 1U;
        lVar10 = uVar6 * 0x18;
        lVar2 = *(long *)(lVar7 + 8 + lVar10);
        lVar4 = lVar4 + (*(long *)(lVar7 + 0x10 + lVar10) - lVar8);
      } while (lVar4 < lVar2);
      iVar5 = __archive_read_seek(a,lVar2 - *(long *)(lVar7 + lVar10),0);
      if (iVar5 < 0) {
        return iVar5;
      }
      iVar3 = archive_read_format_rar_read_header(a,a->entry);
      if (iVar3 != 0) {
LAB_004945dd:
        fmt = "Error during seek of RAR file";
        goto LAB_004943a3;
      }
      *(int *)(pbVar1 + 0x100) = *(int *)(pbVar1 + 0x100) + -1;
    }
LAB_00494416:
    lStack_20 = __archive_read_seek(a,lVar4,0);
    if (-1 < lStack_20) {
      lVar4 = *(long *)(pbVar1 + 0xf8);
      lVar7 = (ulong)*(uint *)(pbVar1 + 0x100) * 0x18;
      *(long *)(pbVar1 + 0xa0) = *(long *)(lVar4 + 0x10 + lVar7) - lStack_20;
      for (; lVar7 != 0; lVar7 = lVar7 + -0x18) {
        lStack_20 = (lStack_20 - *(long *)(lVar4 + 8 + lVar7)) + *(long *)(lVar4 + -8 + lVar7);
      }
      lVar4 = lStack_20 - *(long *)(lVar4 + 8);
      a->read_data_output_offset = 0;
      a->read_data_remaining = 0;
      a->read_data_block = (char *)0x0;
      a->read_data_offset = 0;
      pbVar1[0x98] = 0;
      pbVar1[0x99] = 0;
      pbVar1[0x9a] = 0;
      pbVar1[0x9b] = 0;
      pbVar1[0x9c] = 0;
      pbVar1[0x9d] = 0;
      pbVar1[0x9e] = 0;
      pbVar1[0x9f] = 0;
      pbVar1[0xb0] = 0;
      pbVar1[0xb1] = 0;
      pbVar1[0xb2] = 0;
      pbVar1[0xb3] = 0;
      pbVar1[0xb4] = 0;
      pbVar1[0xb5] = 0;
      pbVar1[0xb6] = 0;
      pbVar1[0xb7] = 0;
      if ((lVar4 != *(long *)(pbVar1 + 0x28)) ||
         (lStack_20 = *(long *)(pbVar1 + 0xc0), *(long *)(pbVar1 + 0xc0) <= lVar4)) {
        *(long *)(pbVar1 + 0xc0) = lVar4;
        lStack_20 = lVar4;
      }
    }
  }
  else {
    fmt = "Seeking of compressed RAR files is unsupported";
LAB_004943a3:
    archive_set_error(&a->archive,-1,fmt);
    lStack_20 = -0x19;
  }
  return lStack_20;
}

Assistant:

static int64_t
archive_read_format_rar_seek_data(struct archive_read *a, int64_t offset,
    int whence)
{
  int64_t client_offset, ret;
  unsigned int i;
  struct rar *rar = (struct rar *)(a->format->data);

  if (rar->compression_method == COMPRESS_METHOD_STORE)
  {
    /* Modify the offset for use with SEEK_SET */
    switch (whence)
    {
      case SEEK_CUR:
        client_offset = rar->offset_seek;
        break;
      case SEEK_END:
        client_offset = rar->unp_size;
        break;
      case SEEK_SET:
      default:
        client_offset = 0;
    }
    client_offset += offset;
    if (client_offset < 0)
    {
      /* Can't seek past beginning of data block */
      return -1;
    }
    else if (client_offset > rar->unp_size)
    {
      /*
       * Set the returned offset but only seek to the end of
       * the data block.
       */
      rar->offset_seek = client_offset;
      client_offset = rar->unp_size;
    }

    client_offset += rar->dbo[0].start_offset;
    i = 0;
    while (i < rar->cursor)
    {
      i++;
      client_offset += rar->dbo[i].start_offset - rar->dbo[i-1].end_offset;
    }
    if (rar->main_flags & MHD_VOLUME)
    {
      /* Find the appropriate offset among the multivolume archive */
      while (1)
      {
        if (client_offset < rar->dbo[rar->cursor].start_offset &&
          rar->file_flags & FHD_SPLIT_BEFORE)
        {
          /* Search backwards for the correct data block */
          if (rar->cursor == 0)
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Attempt to seek past beginning of RAR data block");
            return (ARCHIVE_FAILED);
          }
          rar->cursor--;
          client_offset -= rar->dbo[rar->cursor+1].start_offset -
            rar->dbo[rar->cursor].end_offset;
          if (client_offset < rar->dbo[rar->cursor].start_offset)
            continue;
          ret = __archive_read_seek(a, rar->dbo[rar->cursor].start_offset -
            rar->dbo[rar->cursor].header_size, SEEK_SET);
          if (ret < (ARCHIVE_OK))
            return ret;
          ret = archive_read_format_rar_read_header(a, a->entry);
          if (ret != (ARCHIVE_OK))
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Error during seek of RAR file");
            return (ARCHIVE_FAILED);
          }
          rar->cursor--;
          break;
        }
        else if (client_offset > rar->dbo[rar->cursor].end_offset &&
          rar->file_flags & FHD_SPLIT_AFTER)
        {
          /* Search forward for the correct data block */
          rar->cursor++;
          if (rar->cursor < rar->nodes &&
            client_offset > rar->dbo[rar->cursor].end_offset)
          {
            client_offset += rar->dbo[rar->cursor].start_offset -
              rar->dbo[rar->cursor-1].end_offset;
            continue;
          }
          rar->cursor--;
          ret = __archive_read_seek(a, rar->dbo[rar->cursor].end_offset,
                                    SEEK_SET);
          if (ret < (ARCHIVE_OK))
            return ret;
          ret = archive_read_format_rar_read_header(a, a->entry);
          if (ret == (ARCHIVE_EOF))
          {
            rar->has_endarc_header = 1;
            ret = archive_read_format_rar_read_header(a, a->entry);
          }
          if (ret != (ARCHIVE_OK))
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Error during seek of RAR file");
            return (ARCHIVE_FAILED);
          }
          client_offset += rar->dbo[rar->cursor].start_offset -
            rar->dbo[rar->cursor-1].end_offset;
          continue;
        }
        break;
      }
    }

    ret = __archive_read_seek(a, client_offset, SEEK_SET);
    if (ret < (ARCHIVE_OK))
      return ret;
    rar->bytes_remaining = rar->dbo[rar->cursor].end_offset - ret;
    i = rar->cursor;
    while (i > 0)
    {
      i--;
      ret -= rar->dbo[i+1].start_offset - rar->dbo[i].end_offset;
    }
    ret -= rar->dbo[0].start_offset;

    /* Always restart reading the file after a seek */
    a->read_data_block = NULL;
    a->read_data_offset = 0;
    a->read_data_output_offset = 0;
    a->read_data_remaining = 0;
    rar->bytes_unconsumed = 0;
    rar->offset = 0;

    /*
     * If a seek past the end of file was requested, return the requested
     * offset.
     */
    if (ret == rar->unp_size && rar->offset_seek > rar->unp_size)
      return rar->offset_seek;

    /* Return the new offset */
    rar->offset_seek = ret;
    return rar->offset_seek;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
      "Seeking of compressed RAR files is unsupported");
  }
  return (ARCHIVE_FAILED);
}